

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcp
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  DstUnit *pDVar1;
  DstUnit *pDVar2;
  C *pCVar3;
  utf32_t uVar4;
  utf32_t uVar5;
  uint uVar6;
  C *pCVar7;
  C *p0;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  utf32_t buffer1 [64];
  utf32_t buffer2 [64];
  UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap> local_288;
  EncodingEmitter_s local_280;
  DstUnit *local_268;
  DstUnit *local_260;
  C *local_258;
  C *local_250;
  C *local_248;
  C *local_240;
  DstUnit local_238 [61];
  DstUnit local_144 [3];
  DstUnit local_138 [61];
  DstUnit aDStack_44 [5];
  
  bVar11 = 0 < (long)this->m_length;
  bVar10 = 0 < (long)string->m_length;
  if (bVar11 && bVar10) {
    local_258 = this->m_p + this->m_length;
    pCVar7 = string->m_p;
    local_250 = pCVar7 + string->m_length;
    local_268 = local_144;
    local_260 = aDStack_44;
    p0 = this->m_p;
    do {
      pDVar2 = local_260;
      local_280.super_EncodingEmitter_u.m_replacement = 0xfffd;
      local_288.m_state = 0;
      local_288.m_cp = 0;
      local_280.super_EncodingEmitter_u.m_p = local_238;
      local_280.m_end = local_268;
      local_240 = pCVar7;
      local_248 = enc::Utf8Decoder::
                  decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_s>
                            ((Dfa *)&local_288,&local_280,p0,local_258);
      pCVar3 = local_250;
      pDVar1 = local_280.super_EncodingEmitter_u.m_p;
      local_280.super_EncodingEmitter_u.m_replacement = 0xfffd;
      local_288.m_state = 0;
      local_288.m_cp = 0;
      local_280.super_EncodingEmitter_u.m_p = local_138;
      local_280.m_end = pDVar2;
      pCVar7 = enc::Utf8Decoder::
               decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_s>
                         ((Dfa *)&local_288,&local_280,local_240,local_250);
      uVar9 = (long)pDVar1 - (long)local_238 >> 2;
      uVar8 = (long)local_280.super_EncodingEmitter_u.m_p - (long)local_138 >> 2;
      if (uVar9 < uVar8) {
        uVar8 = uVar9;
      }
      if (uVar8 != 0) {
        uVar9 = 0;
        do {
          uVar4 = enc::toCaseFolded(local_238[uVar9]);
          uVar5 = enc::toCaseFolded(local_138[uVar9]);
          if (uVar4 < uVar5) {
            return -1;
          }
          if (uVar5 < uVar4) {
            return 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      bVar10 = pCVar7 < pCVar3;
      bVar11 = local_248 < local_258;
    } while ((bVar11) && (p0 = local_248, pCVar7 < pCVar3));
  }
  uVar6 = 0xffffffff;
  if (!bVar10) {
    uVar6 = (uint)bVar11;
  }
  return uVar6;
}

Assistant:

int
	cmpIgnoreCase_pcp(const StringRef& string) const {
		typedef enc::Convert<enc::Utf32, Encoding> Convert;
		typedef enc::ConvertResult<utf32_t, C> ConvertResult;

		const C* p1 = m_p;
		const C* end1 = p1 + m_length;
		const C* p2 = string.m_p;
		const C* end2 = p2 + string.m_length;

		while (p1 < end1 && p2 < end2) {
			utf32_t buffer1[64];
			utf32_t buffer2[64];

			ConvertResult result1 = Convert::convert(buffer1, buffer1 + countof(buffer1), p1, end1);
			ConvertResult result2 = Convert::convert(buffer2, buffer2 + countof(buffer2), p2, end2);

			size_t length1 = result1.m_dst - buffer1;
			size_t length2 = result2.m_dst - buffer2;
			size_t length = AXL_MIN(length1, length2);

			for (size_t i = 0; i < length; i++) {
				utf32_t c1 = enc::toCaseFolded(buffer1[i]);
				utf32_t c2 = enc::toCaseFolded(buffer2[i]);

				if (c1 < c2)
					return -1;
				else if (c1 > c2)
					return 1;
			}

			p1 = result1.m_src;
			p2 = result2.m_src;
		}

		return
			p2 < end2 ? -1 :
			p1 < end1 ? 1 : 0;
	}